

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *pnParentMinKey,i64 *pnParentMaxKey)

{
  u8 uVar1;
  byte bVar2;
  BtShared *pBt;
  u8 *puVar3;
  i64 iVar4;
  u32 uVar5;
  ushort uVar6;
  u16 uVar7;
  int iVar8;
  uint uVar9;
  void *__s;
  char *pcVar10;
  int iVar11;
  i64 *piVar12;
  ulong uVar13;
  ulong uVar14;
  char *zFormat;
  DbPage *pPg;
  uint uVar15;
  uint *pCell;
  long *plVar16;
  i64 nMinKey;
  MemPage *pPage;
  CellInfo info;
  i64 local_b0;
  ulong local_a8;
  long *local_a0;
  long *local_98;
  ulong local_90;
  i64 local_88;
  uint local_7c;
  char *local_78;
  MemPage *local_70;
  CellInfo local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88 = 0;
  local_b0 = 0;
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  pcVar10 = pCheck->zPfx;
  local_48._0_4_ = pCheck->v1;
  local_48._4_4_ = pCheck->v2;
  uStack_40 = 0;
  uVar15 = pBt->usableSize;
  uVar14 = (ulong)uVar15;
  local_a0 = pnParentMaxKey;
  local_98 = pnParentMinKey;
  iVar8 = checkRef(pCheck,iPage);
  if (iVar8 != 0) {
    return 0;
  }
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  iVar8 = 0;
  uVar9 = btreeGetPage(pBt,iPage,&local_70,0);
  if (uVar9 != 0) {
    checkAppendMsg(pCheck,"unable to get the page. error code=%d",(ulong)uVar9);
    goto LAB_0013bdc6;
  }
  local_70->isInit = '\0';
  uVar9 = btreeInitPage(local_70);
  if (uVar9 == 0) {
    uVar6 = local_70->nCell;
    iVar8 = 1;
    local_a8 = uVar14;
    local_78 = pcVar10;
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else if (pCheck->mxErr != 0) {
      local_90 = CONCAT44(local_90._4_4_,uVar15 - 5);
      local_7c = uVar15 - 4;
      iVar8 = 0;
      uVar14 = 0;
      do {
        pCheck->zPfx = "On tree page %d cell %d: ";
        pCheck->v1 = iPage;
        pCheck->v2 = (int)uVar14;
        pCell = (uint *)(local_70->aData +
                        (CONCAT11(local_70->aCellIdx[uVar14 * 2],local_70->aCellIdx[uVar14 * 2 + 1])
                        & local_70->maskPage));
        btreeParseCellPtr(local_70,(u8 *)pCell,&local_68);
        uVar5 = local_68.nPayload;
        iVar4 = local_68.nKey;
        if (local_70->intKey != '\0') {
          if (uVar14 == 0) {
            local_88 = local_68.nKey;
          }
          else if (local_68.nKey <= local_b0) {
            checkAppendMsg(pCheck,"Rowid %lld out of order (previous was %lld)",local_68.nKey);
          }
          local_b0 = iVar4;
        }
        if ((local_68.nLocal < uVar5) &&
           ((uint *)((ulong)local_68.iOverflow + (long)pCell) <= local_70->aData + pBt->usableSize))
        {
          uVar9 = ((uVar5 + (int)local_90) - (uint)local_68.nLocal) / local_7c;
          uVar15 = *(uint *)((ulong)local_68.iOverflow + (long)pCell);
          uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18;
          if (pBt->autoVacuum != '\0') {
            checkPtrmap(pCheck,uVar15,'\x03',iPage);
          }
          checkList(pCheck,0,uVar15,uVar9);
        }
        iVar11 = iVar8;
        if (local_70->leaf == '\0') {
          uVar15 = *pCell;
          uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18;
          if (pBt->autoVacuum != '\0') {
            checkPtrmap(pCheck,uVar15,'\x05',iPage);
          }
          piVar12 = &local_b0;
          if (uVar14 == 0) {
            piVar12 = (i64 *)0x0;
          }
          iVar11 = checkTreePage(pCheck,uVar15,&local_88,piVar12);
          if ((uVar14 != 0) && (iVar11 != iVar8)) {
            checkAppendMsg(pCheck,"Child page depth differs");
          }
        }
        iVar8 = iVar11;
        uVar14 = uVar14 + 1;
        uVar6 = local_70->nCell;
      } while ((uVar14 < uVar6) && (pCheck->mxErr != 0));
      iVar8 = iVar8 + 1;
    }
    pcVar10 = local_78;
    if (local_70->leaf == '\0') {
      uVar15 = *(uint *)(local_70->aData + (ulong)local_70->hdrOffset + 8);
      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
      pCheck->zPfx = "On page %d at right child: ";
      pCheck->v1 = iPage;
      if (pBt->autoVacuum != '\0') {
        checkPtrmap(pCheck,uVar15,'\x05',iPage);
        uVar6 = local_70->nCell;
      }
      piVar12 = &local_b0;
      if (uVar6 == 0) {
        piVar12 = (i64 *)0x0;
      }
      checkTreePage(pCheck,uVar15,(i64 *)0x0,piVar12);
      uVar1 = local_70->leaf;
      pCheck->zPfx = "Page %d: ";
      pCheck->v1 = iPage;
      if (uVar1 != '\0') goto LAB_0013badb;
    }
    else {
      pCheck->zPfx = "Page %d: ";
      pCheck->v1 = iPage;
LAB_0013badb:
      if (local_70->intKey != '\0') {
        if (local_98 == (long *)0x0) {
          if ((local_a0 != (long *)0x0) && (local_88 <= *local_a0)) {
            zFormat = "Rowid %lld out of order (min less than parent max of %lld)";
LAB_0013bb85:
            checkAppendMsg(pCheck,zFormat);
          }
        }
        else if (local_a0 == (long *)0x0) {
          if (*local_98 < local_b0) {
            zFormat = "Rowid %lld out of order (max larger than parent min of %lld)";
            goto LAB_0013bb85;
          }
        }
        else {
          if (local_88 <= *local_98) {
            checkAppendMsg(pCheck,"Rowid %lld out of order (min less than parent min of %lld)");
          }
          if (*local_a0 < local_b0) {
            checkAppendMsg(pCheck,"Rowid %lld out of order (max larger than parent max of %lld)");
          }
          *local_98 = local_b0;
        }
      }
    }
    puVar3 = local_70->aData;
    uVar14 = (ulong)local_70->hdrOffset;
    __s = pcache1Alloc(pBt->pageSize);
    pCheck->zPfx = (char *)0x0;
    if (__s == (void *)0x0) {
      pCheck->mallocFailed = 1;
    }
    else {
      uVar15 = ((uint)puVar3[uVar14 + 6] + (uint)puVar3[uVar14 + 5] * 0x100) - 1 & 0xffff;
      memset((void *)((long)__s + (ulong)uVar15 + 1),0,(long)(int)(~uVar15 + (int)local_a8));
      memset(__s,1,(ulong)uVar15 + 1);
      uVar6 = *(ushort *)(puVar3 + uVar14 + 3) << 8 | *(ushort *)(puVar3 + uVar14 + 3) >> 8;
      local_90 = uVar14;
      if (uVar6 != 0) {
        bVar2 = local_70->leaf;
        local_a0 = (long *)CONCAT44(local_a0._4_4_,(int)local_a8 + -4);
        local_98 = (long *)(ulong)uVar6;
        plVar16 = (long *)0x0;
        do {
          uVar6 = *(ushort *)(puVar3 + (long)plVar16 * 2 + uVar14 + (ulong)bVar2 * -4 + 0xc) << 8 |
                  *(ushort *)(puVar3 + (long)plVar16 * 2 + uVar14 + (ulong)bVar2 * -4 + 0xc) >> 8;
          if ((int)local_a0 < (int)(uint)uVar6) {
            iVar11 = uVar6 + 0x10000;
            if ((int)local_a8 < iVar11) {
LAB_0013bc91:
              pCheck->zPfx = (char *)0x0;
              checkAppendMsg(pCheck,"Corruption detected in cell %d on page %d",
                             (ulong)plVar16 & 0xffffffff,(ulong)(uint)iPage);
            }
            else {
LAB_0013bcb8:
              pcVar10 = (char *)((ulong)(iVar11 - 1) + (long)__s);
              do {
                *pcVar10 = *pcVar10 + '\x01';
                iVar11 = iVar11 + -1;
                pcVar10 = pcVar10 + -1;
              } while ((int)(uint)uVar6 < iVar11);
            }
          }
          else {
            uVar7 = cellSizePtr(local_70,puVar3 + uVar6);
            iVar11 = (uint)uVar7 + (uint)uVar6;
            if ((int)local_a8 < iVar11) goto LAB_0013bc91;
            if (uVar7 != 0) goto LAB_0013bcb8;
          }
          plVar16 = (long *)((long)plVar16 + 1);
        } while (plVar16 != local_98);
      }
      uVar14 = local_90;
      uVar6 = *(ushort *)(puVar3 + local_90 + 1) << 8 | *(ushort *)(puVar3 + local_90 + 1) >> 8;
      while (uVar6 != 0) {
        uVar15 = (uint)uVar6;
        uVar9 = (uint)CONCAT11(puVar3[(ulong)uVar15 + 2],puVar3[(ulong)uVar15 + 3]);
        if (uVar9 != 0) {
          iVar11 = uVar9 + uVar15;
          pcVar10 = (char *)((ulong)(((uint)puVar3[(ulong)uVar15 + 2] * 0x100 + uVar15 +
                                     (uint)puVar3[(ulong)uVar15 + 3]) - 1) + (long)__s);
          do {
            *pcVar10 = *pcVar10 + '\x01';
            iVar11 = iVar11 + -1;
            pcVar10 = pcVar10 + -1;
          } while ((int)uVar15 < iVar11);
        }
        uVar6 = *(ushort *)(puVar3 + uVar15) << 8 | *(ushort *)(puVar3 + uVar15) >> 8;
      }
      if ((int)local_a8 < 1) {
        uVar15 = 0;
      }
      else {
        uVar13 = 0;
        uVar15 = 0;
        do {
          if (*(char *)((long)__s + uVar13) == '\0') {
            uVar15 = uVar15 + 1;
          }
          else if ('\x01' < *(char *)((long)__s + uVar13)) {
            checkAppendMsg(pCheck,"Multiple uses for byte %d of page %d",uVar13,(ulong)(uint)iPage);
            break;
          }
          uVar13 = uVar13 + 1;
        } while (local_a8 != uVar13);
      }
      if (uVar15 != puVar3[uVar14 + 7]) {
        checkAppendMsg(pCheck,"Fragmentation of %d bytes reported as %d on page %d",(ulong)uVar15,
                       (ulong)puVar3[uVar14 + 7],(ulong)(uint)iPage);
      }
      pcache1Free(__s);
      pcVar10 = local_78;
    }
    pPg = local_70->pDbPage;
  }
  else {
    iVar8 = 0;
    checkAppendMsg(pCheck,"btreeInitPage() returns error code %d",(ulong)uVar9);
    pPg = local_70->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_0013bdc6:
  pCheck->zPfx = pcVar10;
  pCheck->v1 = (undefined4)local_48;
  pCheck->v2 = local_48._4_4_;
  return iVar8;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    depth = -1;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    depth = -1;
    goto end_of_check;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    pCheck->zPfx = "On tree page %d cell %d: ";
    pCheck->v1 = iPage;
    pCheck->v2 = i;
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nPayload;
    /* For intKey pages, check that the keys are in order.
    */
    if( pPage->intKey ){
      if( i==0 ){
        nMinKey = nMaxKey = info.nKey;
      }else if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck,
           "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &nMinKey, i==0?NULL:&nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCheck->zPfx = "On page %d at right child: ";
    pCheck->v1 = iPage;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    checkTreePage(pCheck, pgno, NULL, !pPage->nCell?NULL:&nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck,
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  pCheck->zPfx = 0;
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
    ** number of cells on the page. */
    nCell = get2byte(&data[hdr+3]);
    /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
    ** immediately follows the b-tree page header. */
    cellStart = hdr + 12 - 4*pPage->leaf;
    /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
    ** integer offsets to the cell contents. */
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        pCheck->zPfx = 0;
        checkAppendMsg(pCheck,
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    /* EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);

end_of_check:
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}